

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O2

bool __thiscall pjson::document::deserialize_start(document *this,uint8 *pStr)

{
  uint8 uVar1;
  bool bVar2;
  uint8 *puVar3;
  char *pcVar4;
  
  (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p = (key_value_t *)0x0;
  (this->super_value_variant).super_value_variant_data.m_type = cJSONValueTypeNull;
  pool_allocator::reset(&this->m_allocator);
  this->m_pStart = pStr;
  puVar3 = skip_whitespace(this,pStr);
  this->m_pStr = puVar3;
  uVar1 = *puVar3;
  if (uVar1 == '\0') {
    pcVar4 = "Nothing to deserialize";
  }
  else if ((uVar1 == '{') || (uVar1 == '[')) {
    (this->super_value_variant).super_value_variant_data.m_type =
         (uVar1 == '{') + cJSONValueTypeArray;
    (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p = (key_value_t *)0x0;
    *(undefined8 *)((long)&(this->super_value_variant).super_value_variant_data.m_data + 8) = 0;
    bVar2 = deserialize_internal(this);
    if (!bVar2) {
      return false;
    }
    puVar3 = skip_whitespace(this,this->m_pStr);
    this->m_pStr = puVar3;
    if (*puVar3 == '\0') {
      return true;
    }
    pcVar4 = "Unknown data at end of document";
  }
  else {
    pcVar4 = "Root value must be an object or array";
  }
  (this->m_error_info).m_ofs = (long)puVar3 - (long)this->m_pStart;
  (this->m_error_info).m_pError_message = pcVar4;
  return false;
}

Assistant:

bool deserialize_start(uint8* pStr)
      {
         set_to_null();

#if PJSON_PARSE_STATS
         m_parse_stats.clear();
#endif

         m_allocator.reset();

         m_pStart = pStr;
         
         m_pStr = skip_whitespace(pStr);
         
         if (!*m_pStr)
            return set_error(m_pStr, "Nothing to deserialize");

         bool success = false;

         uint8 c = *m_pStr;
         if ((c == '{') || (c == '['))
         {
            set_to_node(c == '{'); PJSON_INCREMENT_STAT(m_num_control);
            success = deserialize_internal();
         }
         else
            return set_error(m_pStr, "Root value must be an object or array");

         if (success)
         {
            m_pStr = skip_whitespace(m_pStr);
            success = !*m_pStr;
            if (!success)
               set_error(m_pStr, "Unknown data at end of document");
         }

         return success;
      }